

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall
Protocol::MQTT::V5::PropertiesView::readFrom(PropertiesView *this,uint8 *_buffer,uint32 bufLength)

{
  ushort uVar1;
  ushort uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint uVar5;
  
  (this->length).size = 0;
  while( true ) {
    uVar1 = (this->length).size;
    if (bufLength <= uVar1) {
      uVar5 = 0xfffffffe;
      goto LAB_00121901;
    }
    (this->length).field_0.value[uVar1] = _buffer[uVar1];
    uVar1 = (this->length).size;
    uVar2 = uVar1 + 1;
    (this->length).size = uVar2;
    if (-1 < (char)(this->length).field_0.value[uVar1]) break;
    if (uVar2 == 4) {
      uVar5 = 0xffffffff;
LAB_00121901:
      uVar4 = uVar5;
      if (uVar5 < 0xfffffffd) {
        uVar3 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
        uVar4 = 0xfffffffe;
        if (uVar3 <= bufLength - (this->length).size) {
          this->buffer = _buffer + uVar5;
          uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
          uVar4 = uVar4 + uVar5;
        }
      }
      return uVar4;
    }
  }
  uVar5 = (uint)uVar2;
  goto LAB_00121901;
}

Assistant:

uint32 readFrom(const uint8 * _buffer, uint32 bufLength)
                {
                    uint32 o = length.readFrom(_buffer, bufLength);
                    if (isError(o)) return o;
                    if ((uint32)length > bufLength - length.getSize()) return NotEnoughData;
                    buffer = _buffer + o;
                    return o + (uint32)length;
                }